

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

void __thiscall ON_String::Destroy(ON_String *this)

{
  __int_type _Var1;
  ON_aStringHeader *hdr_00;
  ON_aStringHeader *hdr;
  ON_String *this_local;
  
  hdr_00 = Header(this);
  if ((hdr_00 != pEmptyStringHeader) && (hdr_00 != (ON_aStringHeader *)0x0)) {
    _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)hdr_00);
    if (0 < _Var1) {
      ON_aStringHeader_DecrementRefCountAndDeleteIfZero(hdr_00);
    }
  }
  Create(this);
  return;
}

Assistant:

void ON_String::Destroy()
{
  ON_aStringHeader* hdr = Header();
  if (hdr != pEmptyStringHeader && nullptr != hdr && (int)(hdr->ref_count) > 0)
    ON_aStringHeader_DecrementRefCountAndDeleteIfZero(hdr);
	Create();
}